

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkformat_str.c
# Opt level: O2

int ktx_strcasecmp(char *s1,char *s2)

{
  int iVar1;
  __int32_t **pp_Var2;
  long lVar3;
  
  pp_Var2 = __ctype_tolower_loc();
  lVar3 = 0;
  while( true ) {
    iVar1 = (*pp_Var2)[(byte)s1[lVar3]] - (*pp_Var2)[(byte)s2[lVar3]];
    if (iVar1 != 0) {
      return iVar1;
    }
    if (s1[lVar3] == 0) break;
    lVar3 = lVar3 + 1;
  }
  return 0;
}

Assistant:

static int ktx_strcasecmp(const char* s1, const char* s2) {
    const unsigned char* us1 = (const unsigned char*) s1;
    const unsigned char* us2 = (const unsigned char*) s2;

    while (tolower(*us1) == tolower(*us2)) {
        if (*us1 == '\0')
            return 0;
        ++us1;
        ++us2;
    }
    return tolower(*us1) - tolower(*us2);
}